

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_format_priv.h
# Opt level: O0

void _ST_PRIVATE::format_numeric_s<signed_char>
               (format_spec *format,format_writer *output,char value)

{
  uchar value_00;
  char *text;
  size_t size;
  numeric_type local_54;
  undefined1 local_40 [4];
  numeric_type ntype;
  uint_formatter<unsigned_char> formatter;
  int local_20;
  bool upper_case;
  int radix;
  char value_local;
  format_writer *output_local;
  format_spec *format_local;
  
  local_20 = 10;
  formatter.m_start._7_1_ = 0;
  switch(format->digit_class) {
  case digit_default:
  case digit_dec:
    break;
  case digit_hex_upper:
    formatter.m_start._7_1_ = 1;
  case digit_hex:
    local_20 = 0x10;
    break;
  case digit_oct:
    local_20 = 8;
    break;
  case digit_bin:
    local_20 = 2;
    break;
  default:
    assert_handler("/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/include/st_format_priv.h"
                   ,0x94,"Invalid digit class for _format_numeric_s");
  }
  ST::uint_formatter<unsigned_char>::uint_formatter((uint_formatter<unsigned_char> *)local_40);
  value_00 = value;
  if (value < '\x01') {
    value_00 = -value;
  }
  ST::uint_formatter<unsigned_char>::format
            ((uint_formatter<unsigned_char> *)local_40,value_00,local_20,
             (bool)(formatter.m_start._7_1_ & 1));
  if (value == '\0') {
    local_54 = numeric_zero;
  }
  else {
    local_54 = (numeric_type)(value < '\0');
  }
  text = ST::uint_formatter<unsigned_char>::text((uint_formatter<unsigned_char> *)local_40);
  size = ST::uint_formatter<unsigned_char>::size((uint_formatter<unsigned_char> *)local_40);
  format_numeric_string(format,output,text,size,local_54);
  return;
}

Assistant:

void format_numeric_s(const ST::format_spec &format,
                          ST::format_writer &output, int_T value)
    {
        static_assert(std::is_signed<int_T>::value,
                      "Use _format_numeric_u for unsigned numerics");

        int radix = 10;
        bool upper_case = false;
        switch (format.digit_class) {
        case ST::digit_hex_upper:
            upper_case = true;
            /* fall through */
        case ST::digit_hex:
            radix = 16;
            break;
        case ST::digit_oct:
            radix = 8;
            break;
        case ST::digit_bin:
            radix = 2;
            break;
        case ST::digit_dec:
        case ST::digit_default:
            break;
        default:
            ST_ASSERT(false, "Invalid digit class for _format_numeric_s");
        }

        typedef typename std::make_unsigned<int_T>::type uint_T;
        ST::uint_formatter<uint_T> formatter;
        formatter.format(static_cast<uint_T>(std::abs(value)), radix, upper_case);

        const numeric_type ntype = (value == 0) ? numeric_zero
                                 : (value < 0) ? numeric_negative
                                 : numeric_positive;

        format_numeric_string(format, output, formatter.text(), formatter.size(), ntype);
    }